

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall TApp_IniOverwrite_Test::~TApp_IniOverwrite_Test(TApp_IniOverwrite_Test *this)

{
  TApp_IniOverwrite_Test *this_local;
  
  ~TApp_IniOverwrite_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniOverwrite) {

    TempFile tmpini{"TestIniTmp.ini"};
    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "two=99" << std::endl;
    }

    std::string orig = "filename_not_exist.ini";
    std::string next = "TestIniTmp.ini";
    app.set_config("--config", orig);
    // Make sure this can be overwritten
    app.set_config("--conf", next);
    int two = 7;
    app.add_option("--two", two);

    run();

    EXPECT_EQ(99, two);
}